

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul-lace.c
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *ctx_00;
  float *A_00;
  float *A_01;
  double dVar3;
  double dVar4;
  double t2;
  double t1;
  float *C2;
  float *C1;
  float *B;
  float *A;
  int n;
  uint uStack_1c;
  char c;
  int dqsize;
  int workers;
  char **argv_local;
  int argc_local;
  
  uStack_1c = 1;
  n = 100000;
  while( true ) {
    while( true ) {
      while( true ) {
        iVar2 = getopt(argc,argv,"w:q:h");
        cVar1 = (char)iVar2;
        if (cVar1 == -1) {
          if (_optind != argc) {
            iVar2 = atoi(argv[_optind]);
            ctx = (EVP_PKEY_CTX *)malloc((long)(iVar2 * iVar2) << 2);
            ctx_00 = (EVP_PKEY_CTX *)malloc((long)(iVar2 * iVar2) << 2);
            A_00 = (float *)malloc((long)(iVar2 * iVar2) << 2);
            A_01 = (float *)malloc((long)(iVar2 * iVar2) << 2);
            init(ctx);
            init(ctx_00);
            zero(A_00,iVar2);
            zero(A_01,iVar2);
            lace_start(uStack_1c,(long)n);
            dVar3 = wctime();
            rec_matmul_RUN((float *)ctx,(float *)ctx_00,A_01,iVar2,iVar2,iVar2,iVar2,0);
            dVar4 = wctime();
            printf("Time: %f\n",dVar4 - dVar3);
            lace_stop();
            free(A_01);
            free(A_00);
            free(ctx_00);
            free(ctx);
            return 0;
          }
          usage(*argv);
          exit(1);
        }
        if (cVar1 != 'h') break;
        usage(*argv);
      }
      if (cVar1 != 'q') break;
      n = atoi(_optarg);
    }
    if (cVar1 != 'w') break;
    uStack_1c = atoi(_optarg);
  }
  abort();
}

Assistant:

int main(int argc, char *argv[])
{
    int workers = 1;
    int dqsize = 100000;

    char c;
    while ((c=getopt(argc, argv, "w:q:h")) != -1) {
        switch (c) {
            case 'w':
                workers = atoi(optarg);
                break;
            case 'q':
                dqsize = atoi(optarg);
                break;
            case 'h':
                usage(argv[0]);
                break;
            default:
                abort();
        }
    }

    if (optind == argc) {
        usage(argv[0]);
        exit(1);
    }

    int n = atoi(argv[optind]);

    REAL *A  = malloc(n * n * sizeof(REAL));
    REAL *B  = malloc(n * n * sizeof(REAL));
    REAL *C1 = malloc(n * n * sizeof(REAL));
    REAL *C2 = malloc(n * n * sizeof(REAL));

    init(A, n);
    init(B, n);
    zero(C1, n);
    zero(C2, n);

    lace_start(workers, dqsize);

    double t1 = wctime();
    RUN(rec_matmul, A, B, C2, n, n, n, n, 0); 
    double t2 = wctime();

    printf("Time: %f\n", t2-t1);
/*
    iter_matmul(A, B, C1, n);
    double err = maxerror(C1, C2, n);

    printf("Max error matmul(%d x %d) = %g\n", n, n, err);
*/
    lace_stop();

    free(C2);
    free(C1);
    free(B);
    free(A);
    return 0;
}